

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddColor
          (X3DImporter *this,aiMesh *pMesh,
          list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pColors,bool pColorPerVertex)

{
  undefined8 *puVar1;
  uint uVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  aiColor4D *paVar5;
  long lVar6;
  runtime_error *prVar7;
  long *plVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  size_type *psVar10;
  long *plVar11;
  ulong uVar12;
  ulong uVar13;
  _Self __tmp;
  _List_node_base *p_Var14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var14 = (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  uVar9 = (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
          _M_node._M_size;
  if ((int)CONCAT71(in_register_00000009,pColorPerVertex) == 0) {
    if (uVar9 < pMesh->mNumFaces) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>
                (&local_90,
                 (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                 _M_impl._M_node._M_size);
      std::operator+(&local_70,"MeshGeometry_AddColor1. Colors count(",&local_90);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_f0._M_dataplus._M_p = (pointer)*plVar8;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_f0._M_dataplus._M_p == psVar10) {
        local_f0.field_2._M_allocated_capacity = *psVar10;
        local_f0.field_2._8_8_ = plVar8[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar10;
      }
      local_f0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      to_string<unsigned_int>(&local_b0,pMesh->mNumFaces);
      std::operator+(&local_50,&local_f0,&local_b0);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_d0 = (long *)*plVar8;
      plVar11 = plVar8 + 2;
      if (local_d0 == plVar11) {
        local_c0 = *plVar11;
        lStack_b8 = plVar8[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar11;
      }
      local_c8 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::runtime_error::runtime_error(prVar7,(string *)&local_d0);
      *(undefined ***)prVar7 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar2 = pMesh->mNumVertices;
    uVar9 = (ulong)uVar2 << 4;
    paVar5 = (aiColor4D *)operator_new__(uVar9);
    if ((ulong)uVar2 != 0) {
      memset(paVar5,0,uVar9);
    }
    pMesh->mColors[0] = paVar5;
    if (pMesh->mNumFaces != 0) {
      uVar9 = 0;
      do {
        uVar12 = (ulong)pMesh->mFaces[uVar9].mNumIndices;
        if (uVar12 != 0) {
          uVar13 = 0;
          do {
            paVar5 = pMesh->mColors[0];
            uVar2 = pMesh->mFaces[uVar9].mIndices[uVar13];
            p_Var4 = p_Var14[1]._M_prev;
            *(_List_node_base **)(paVar5 + uVar2) = p_Var14[1]._M_next;
            *(_List_node_base **)&paVar5[uVar2].b = p_Var4;
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        p_Var14 = p_Var14->_M_next;
        uVar9 = uVar9 + 1;
      } while (uVar9 < pMesh->mNumFaces);
    }
  }
  else {
    uVar12 = (ulong)pMesh->mNumVertices;
    if (uVar9 < uVar12) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>
                (&local_90,
                 (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                 _M_impl._M_node._M_size);
      std::operator+(&local_70,"MeshGeometry_AddColor1. Colors count(",&local_90);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_f0._M_dataplus._M_p = (pointer)*plVar8;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_f0._M_dataplus._M_p == psVar10) {
        local_f0.field_2._M_allocated_capacity = *psVar10;
        local_f0.field_2._8_8_ = plVar8[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar10;
      }
      local_f0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      to_string<unsigned_int>(&local_b0,pMesh->mNumVertices);
      std::operator+(&local_50,&local_f0,&local_b0);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_d0 = (long *)*plVar8;
      plVar11 = plVar8 + 2;
      if (local_d0 == plVar11) {
        local_c0 = *plVar11;
        lStack_b8 = plVar8[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar11;
      }
      local_c8 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::runtime_error::runtime_error(prVar7,(string *)&local_d0);
      *(undefined ***)prVar7 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar5 = (aiColor4D *)operator_new__(uVar12 << 4);
    if (uVar12 != 0) {
      memset(paVar5,0,uVar12 << 4);
    }
    pMesh->mColors[0] = paVar5;
    if (pMesh->mNumVertices != 0) {
      lVar6 = 0;
      uVar9 = 0;
      do {
        p_Var4 = p_Var14 + 1;
        p_Var3 = p_Var14[1]._M_prev;
        p_Var14 = p_Var14->_M_next;
        puVar1 = (undefined8 *)((long)&pMesh->mColors[0]->r + lVar6);
        *puVar1 = p_Var4->_M_next;
        puVar1[1] = p_Var3;
        uVar9 = uVar9 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar9 < pMesh->mNumVertices);
    }
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddColor(aiMesh& pMesh, const std::list<aiColor4D>& pColors, const bool pColorPerVertex) const
{
    std::list<aiColor4D>::const_iterator col_it = pColors.begin();

	if(pColorPerVertex)
	{
		if(pColors.size() < pMesh.mNumVertices)
		{
			throw DeadlyImportError("MeshGeometry_AddColor1. Colors count(" + to_string(pColors.size()) + ") can not be less than Vertices count(" +
									to_string(pMesh.mNumVertices) +  ").");
		}

		// copy colors to mesh
		pMesh.mColors[0] = new aiColor4D[pMesh.mNumVertices];
		for(size_t i = 0; i < pMesh.mNumVertices; i++) pMesh.mColors[0][i] = *col_it++;
	}// if(pColorPerVertex)
	else
	{
		if(pColors.size() < pMesh.mNumFaces)
		{
			throw DeadlyImportError("MeshGeometry_AddColor1. Colors count(" + to_string(pColors.size()) + ") can not be less than Faces count(" +
									to_string(pMesh.mNumFaces) +  ").");
		}

		// copy colors to mesh
		pMesh.mColors[0] = new aiColor4D[pMesh.mNumVertices];
		for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
		{
			// apply color to all vertices of face
            for ( size_t vi = 0, vi_e = pMesh.mFaces[ fi ].mNumIndices; vi < vi_e; vi++ )
            {
                pMesh.mColors[ 0 ][ pMesh.mFaces[ fi ].mIndices[ vi ] ] = *col_it;
            }

			++col_it;
		}
	}// if(pColorPerVertex) else
}